

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void setup_rel32(gen_ctx_t gen_ctx,label_ref_t *lr,uint8_t *base,void *addr)

{
  undefined4 local_3c;
  long lStack_38;
  int32_t rel32;
  int64_t offset;
  MIR_context_t ctx;
  void *addr_local;
  uint8_t *base_local;
  label_ref_t *lr_local;
  gen_ctx_t gen_ctx_local;
  
  offset = (int64_t)gen_ctx->ctx;
  lStack_38 = (long)addr - (long)(base + lr->next_insn_disp);
  local_3c = (undefined4)lStack_38;
  ctx = (MIR_context_t)addr;
  addr_local = base;
  base_local = (uint8_t *)lr;
  lr_local = (label_ref_t *)gen_ctx;
  if (((lr->abs_addr_p == '\0') && (-0x80000001 < lStack_38)) && (lStack_38 < 0x80000000)) {
    _MIR_change_code((MIR_context_t)offset,base + lr->label_val_disp,(uint8_t *)&local_3c,4);
    return;
  }
  fprintf(_stderr,"too big offset (%lld) in setup_rel32",lStack_38);
  exit(1);
}

Assistant:

static void setup_rel32 (gen_ctx_t gen_ctx, label_ref_t *lr, uint8_t *base, void *addr) {
  MIR_context_t ctx = gen_ctx->ctx;
  int64_t offset = (int64_t) addr - (int64_t) (base + lr->next_insn_disp);
  int32_t rel32 = (int32_t) offset;

  if (lr->abs_addr_p || !(INT32_MIN <= offset && offset <= INT32_MAX)) {
    fprintf (stderr, "too big offset (%lld) in setup_rel32", (long long) offset);
    exit (1);
  }
  _MIR_change_code (ctx, (uint8_t *) base + lr->label_val_disp, (uint8_t *) &rel32, 4);
}